

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_x509.cc
# Opt level: O0

int i2d_X509_AUX(X509 *a,uchar **pp)

{
  uchar *local_30;
  uchar *tmp;
  uchar **ppuStack_20;
  int length;
  uchar **pp_local;
  X509 *a_local;
  
  ppuStack_20 = pp;
  pp_local = (uchar **)a;
  if ((pp == (uchar **)0x0) || (*pp != (uchar *)0x0)) {
    a_local._4_4_ = i2d_x509_aux_internal((X509 *)a,pp);
  }
  else {
    tmp._4_4_ = i2d_x509_aux_internal((X509 *)a,(uchar **)0x0);
    a_local._4_4_ = tmp._4_4_;
    if (0 < tmp._4_4_) {
      local_30 = (uchar *)OPENSSL_malloc((long)tmp._4_4_);
      *ppuStack_20 = local_30;
      if (local_30 == (uchar *)0x0) {
        a_local._4_4_ = -1;
      }
      else {
        tmp._4_4_ = i2d_x509_aux_internal((X509 *)pp_local,&local_30);
        if (tmp._4_4_ < 1) {
          OPENSSL_free(*ppuStack_20);
          *ppuStack_20 = (uchar *)0x0;
        }
        a_local._4_4_ = tmp._4_4_;
      }
    }
  }
  return a_local._4_4_;
}

Assistant:

int i2d_X509_AUX(X509 *a, unsigned char **pp) {
  int length;
  unsigned char *tmp;

  // Buffer provided by caller
  if (pp == NULL || *pp != NULL) {
    return i2d_x509_aux_internal(a, pp);
  }

  // Obtain the combined length
  if ((length = i2d_x509_aux_internal(a, NULL)) <= 0) {
    return length;
  }

  // Allocate requisite combined storage
  *pp = tmp = reinterpret_cast<uint8_t *>(OPENSSL_malloc(length));
  if (tmp == NULL) {
    return -1;  // Push error onto error stack?
  }

  // Encode, but keep *pp at the originally malloced pointer
  length = i2d_x509_aux_internal(a, &tmp);
  if (length <= 0) {
    OPENSSL_free(*pp);
    *pp = NULL;
  }
  return length;
}